

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,TimeUnit value)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "TimeUnit::Microseconds";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "TimeUnit::Milliseconds";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "TimeUnit::Seconds";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "TimeUnit::Minutes";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "TimeUnit::Hours";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "ToString: Unknown TimeUnit";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(TimeUnit value)
{
    switch (value)
    {
    case TimeUnit::Microseconds:
        return "TimeUnit::Microseconds";
    case TimeUnit::Milliseconds:
        return "TimeUnit::Milliseconds";
    case TimeUnit::Seconds:
        return "TimeUnit::Seconds";
    case TimeUnit::Minutes:
        return "TimeUnit::Minutes";
    case TimeUnit::Hours:
        return "TimeUnit::Hours";
    default:
        return "ToString: Unknown TimeUnit";
    }
}